

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9_value_string(jx9_value *pVal,char *zString,int nLen)

{
  int in_EAX;
  sxi32 sVar1;
  
  if ((pVal->iFlags & 1) == 0) {
    jx9MemObjRelease(pVal);
    in_EAX = (pVal->iFlags & 0xfffffe90U) + 1;
    pVal->iFlags = in_EAX;
  }
  if (zString != (char *)0x0) {
    if (nLen < 0) {
      nLen = SyStrlen(zString);
    }
    sVar1 = SyBlobAppend(&pVal->sBlob,zString,nLen);
    return sVar1;
  }
  return in_EAX;
}

Assistant:

JX9_PRIVATE int jx9_value_string(jx9_value *pVal, const char *zString, int nLen)
{
	if((pVal->iFlags & MEMOBJ_STRING) == 0 ){
		/* Invalidate any prior representation */
		jx9MemObjRelease(pVal);
		MemObjSetType(pVal, MEMOBJ_STRING);
	}
	if( zString ){
		if( nLen < 0 ){
			/* Compute length automatically */
			nLen = (int)SyStrlen(zString);
		}
		SyBlobAppend(&pVal->sBlob, (const void *)zString, (sxu32)nLen);
	}
	return JX9_OK;
}